

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * gl4cts::anon_unknown_0::GetInputM1
                 (vector<float,_std::allocator<float>_> *in,
                 vector<float,_std::allocator<float>_> *expected)

{
  reference pvVar1;
  vector<float,_std::allocator<float>_> *expected_local;
  vector<float,_std::allocator<float>_> *in_local;
  
  std::vector<float,_std::allocator<float>_>::resize(in,8);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,0);
  *pvVar1 = 1.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,2);
  *pvVar1 = 3.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,1);
  *pvVar1 = 2.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,3);
  *pvVar1 = 4.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,4);
  *pvVar1 = 1.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,6);
  *pvVar1 = 3.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,5);
  *pvVar1 = 2.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in,7);
  *pvVar1 = 4.0;
  std::vector<float,_std::allocator<float>_>::resize(expected,4);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](expected,0);
  *pvVar1 = 7.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](expected,2);
  *pvVar1 = 15.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](expected,1);
  *pvVar1 = 10.0;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](expected,3);
  *pvVar1 = 22.0;
  return 
  "\nlayout(std430, binding = 0) buffer Input {\n  mat2 m0;\n  mat2 m1;\n} g_input;\nlayout(std430, binding = 1) buffer Output {\n  mat2 m;\n} g_output;\nvoid main() { g_output.m = g_input.m0 * g_input.m1; }"
  ;
}

Assistant:

const char* GetInputM1(std::vector<float>& in, std::vector<float>& expected)
{
	in.resize(8);
	in[0] = 1.0f;
	in[2] = 3.0f;
	in[1] = 2.0f;
	in[3] = 4.0f;
	in[4] = 1.0f;
	in[6] = 3.0f;
	in[5] = 2.0f;
	in[7] = 4.0f;
	expected.resize(4);
	expected[0] = 7.0f;
	expected[2] = 15.0f;
	expected[1] = 10.0f;
	expected[3] = 22.0f;

	return NL "layout(std430, binding = 0) buffer Input {" NL "  mat2 m0;" NL "  mat2 m1;" NL "} g_input;" NL
			  "layout(std430, binding = 1) buffer Output {" NL "  mat2 m;" NL "} g_output;" NL
			  "void main() { g_output.m = g_input.m0 * g_input.m1; }";
}